

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

void __thiscall Fl_Type::read_property(Fl_Type *this,char *c)

{
  int iVar1;
  char *pcVar2;
  char **p;
  fd_set *in_R8;
  timeval *in_R9;
  
  iVar1 = strcmp(c,"label");
  if (iVar1 == 0) {
    pcVar2 = read_word(0);
    label(this,pcVar2);
    return;
  }
  iVar1 = strcmp(c,"user_data");
  if (iVar1 == 0) {
    pcVar2 = read_word(0);
    p = &this->user_data_;
  }
  else {
    iVar1 = strcmp(c,"user_data_type");
    if (iVar1 == 0) {
      pcVar2 = read_word(0);
      p = &this->user_data_type_;
    }
    else {
      iVar1 = strcmp(c,"callback");
      if (iVar1 != 0) {
        iVar1 = strcmp(c,"comment");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          comment(this,pcVar2);
          return;
        }
        iVar1 = strcmp(c,"open");
        if (iVar1 != 0) {
          iVar1 = strcmp(c,"selected");
          if (iVar1 != 0) {
            read_error("Unknown property \"%s\"",c);
            return;
          }
          Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)this,(fd_set *)&DAT_00000001,
                              (fd_set *)&DAT_00000001,in_R8,in_R9);
          return;
        }
        this->open_ = '\x01';
        return;
      }
      pcVar2 = read_word(0);
      p = &this->callback_;
    }
  }
  storestring(pcVar2,p,0);
  return;
}

Assistant:

void Fl_Type::read_property(const char *c) {
  if (!strcmp(c,"label"))
    label(read_word());
  else if (!strcmp(c,"user_data"))
    user_data(read_word());
  else if (!strcmp(c,"user_data_type"))
    user_data_type(read_word());
  else if (!strcmp(c,"callback"))
    callback(read_word());
  else if (!strcmp(c,"comment"))
    comment(read_word());
  else if (!strcmp(c,"open"))
    open_ = 1;
  else if (!strcmp(c,"selected"))
    select(this,1);
  else
    read_error("Unknown property \"%s\"", c);
}